

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixMapfile(unixFile *pFd,i64 nByte)

{
  uint uVar1;
  void *pvVar2;
  unsigned_short uVar3;
  int iVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  char *zFunc;
  stat statbuf;
  
  if (0 < pFd->nFetchOut) {
    return 0;
  }
  if ((nByte < 0) &&
     (iVar4 = (*aSyscall[5].pCurrent)((ulong)(uint)pFd->h,&statbuf), nByte = statbuf.st_size,
     iVar4 != 0)) {
    return 0x70a;
  }
  uVar6 = pFd->mmapSizeMax;
  if (nByte < pFd->mmapSizeMax) {
    uVar6 = nByte;
  }
  if (uVar6 == pFd->mmapSize) {
    return 0;
  }
  if ((long)uVar6 < 1) {
    unixUnmapfile(pFd);
    return 0;
  }
  uVar1 = pFd->h;
  pvVar2 = pFd->pMapRegion;
  uVar3 = pFd->ctrlFlags;
  if (pvVar2 == (void *)0x0) {
    zFunc = "mmap";
  }
  else {
    uVar7 = pFd->mmapSize & 0xfffffffffffffe00;
    if (pFd->mmapSizeActual != uVar7) {
      (*aSyscall[0x16].pCurrent)(uVar7 + (long)pvVar2);
    }
    pvVar5 = (void *)(*aSyscall[0x17].pCurrent)(pvVar2,uVar7,uVar6,1);
    if (1 < (long)pvVar5 + 1U) {
      zFunc = "mremap";
      goto LAB_00124759;
    }
    (*aSyscall[0x16].pCurrent)(pvVar2,uVar7);
    zFunc = "mremap";
    if (pvVar5 != (void *)0x0) goto LAB_00124759;
  }
  pvVar5 = (void *)(*aSyscall[0x15].pCurrent)
                             (0,uVar6,(ulong)((uint)((uVar3 & 2) == 0) * 2 + 1),1,(ulong)uVar1,0);
LAB_00124759:
  if (pvVar5 == (void *)0xffffffffffffffff) {
    pvVar5 = (void *)0x0;
    unixLogErrorAtLine(0,zFunc,pFd->zPath,0x6c94);
    pFd->mmapSizeMax = 0;
    uVar6 = 0;
  }
  pFd->pMapRegion = pvVar5;
  pFd->mmapSizeActual = uVar6;
  pFd->mmapSize = uVar6;
  return 0;
}

Assistant:

static int unixMapfile(unixFile *pFd, i64 nByte){
#if SQLITE_MAX_MMAP_SIZE>0
  i64 nMap = nByte;
  int rc;

  assert( nMap>=0 || pFd->nFetchOut==0 );
  if( pFd->nFetchOut>0 ) return SQLITE_OK;

  if( nMap<0 ){
    struct stat statbuf;          /* Low-level file information */
    rc = osFstat(pFd->h, &statbuf);
    if( rc!=SQLITE_OK ){
      return SQLITE_IOERR_FSTAT;
    }
    nMap = statbuf.st_size;
  }
  if( nMap>pFd->mmapSizeMax ){
    nMap = pFd->mmapSizeMax;
  }

  if( nMap!=pFd->mmapSize ){
    if( nMap>0 ){
      unixRemapfile(pFd, nMap);
    }else{
      unixUnmapfile(pFd);
    }
  }
#endif

  return SQLITE_OK;
}